

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argsman_tests.cpp
# Opt level: O0

void __thiscall argsman_tests::util_NoIncludeConf::test_method(util_NoIncludeConf *this)

{
  bool bVar1;
  NoIncludeConfTest *in_RDI;
  long in_FS_OFFSET;
  char *in_stack_fffffffffffffde8;
  char *in_stack_fffffffffffffdf0;
  char *in_stack_fffffffffffffdf8;
  const_string *in_stack_fffffffffffffe10;
  const_string *msg;
  size_t in_stack_fffffffffffffe18;
  undefined1 *line_num;
  const_string *in_stack_fffffffffffffe20;
  char *file;
  unit_test_log_t *in_stack_fffffffffffffe28;
  unit_test_log_t *this_00;
  char *arg;
  undefined1 local_158 [16];
  undefined1 local_148 [32];
  undefined1 local_128 [16];
  const_string local_118;
  undefined1 local_108 [16];
  undefined1 local_f8 [64];
  undefined1 local_b8 [16];
  undefined1 local_a8 [64];
  undefined1 local_68 [32];
  undefined1 local_48 [32];
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    arg = (char *)0x66;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
               (unsigned_long)in_stack_fffffffffffffde8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffde8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
               in_stack_fffffffffffffe10);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffdf0,(char (*) [1])in_stack_fffffffffffffde8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
               (unsigned_long)in_stack_fffffffffffffde8);
    NoIncludeConfTest::Parse_abi_cxx11_(in_RDI,arg);
    in_stack_fffffffffffffdf8 = "\"\"";
    in_stack_fffffffffffffdf0 = "";
    in_stack_fffffffffffffde8 = "Parse(\"-noincludeconf\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[1]>
              (local_a8,local_b8,0xcc,1,2,local_28);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffde8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffde8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
               (unsigned_long)in_stack_fffffffffffffde8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffde8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
               in_stack_fffffffffffffe10);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffdf0,(char (*) [1])in_stack_fffffffffffffde8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
               (unsigned_long)in_stack_fffffffffffffde8);
    NoIncludeConfTest::Parse_abi_cxx11_(in_RDI,arg);
    in_stack_fffffffffffffdf8 =
         "\"-includeconf cannot be used from commandline; -includeconf=\\\"\\\"\"";
    in_stack_fffffffffffffdf0 = "-includeconf cannot be used from commandline; -includeconf=\"\"";
    in_stack_fffffffffffffde8 = "Parse(\"-includeconf\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[62]>
              (local_f8,local_108,0xcd,1,2,local_48);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffde8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffde8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    file = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    msg = &local_118;
    this_00 = (unit_test_log_t *)0x66;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
               (unsigned_long)in_stack_fffffffffffffde8);
    line_num = local_128;
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffde8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (this_00,(const_string *)file,(size_t)line_num,msg);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffdf0,(char (*) [1])in_stack_fffffffffffffde8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
               (unsigned_long)in_stack_fffffffffffffde8);
    NoIncludeConfTest::Parse_abi_cxx11_(in_RDI,arg);
    in_stack_fffffffffffffdf8 =
         "\"-includeconf cannot be used from commandline; -includeconf=\\\"file\\\"\"";
    in_stack_fffffffffffffdf0 =
         "-includeconf cannot be used from commandline; -includeconf=\"file\"";
    in_stack_fffffffffffffde8 = "Parse(\"-includeconf=file\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[66]>
              (local_148,local_158,0xce,1,2,local_68);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffde8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffde8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_FIXTURE_TEST_CASE(util_NoIncludeConf, NoIncludeConfTest)
{
    BOOST_CHECK_EQUAL(Parse("-noincludeconf"), "");
    BOOST_CHECK_EQUAL(Parse("-includeconf"), "-includeconf cannot be used from commandline; -includeconf=\"\"");
    BOOST_CHECK_EQUAL(Parse("-includeconf=file"), "-includeconf cannot be used from commandline; -includeconf=\"file\"");
}